

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O0

void * UnionUnderlyingType::ABCUnion::UnPack(void *obj,ABC type,resolver_function_t *resolver)

{
  C *ptr_2;
  B *ptr_1;
  A *ptr;
  resolver_function_t *resolver_local;
  ABC type_local;
  void *obj_local;
  
  if (type == A) {
    obj_local = A::UnPack((A *)obj,resolver);
  }
  else if (type == B) {
    obj_local = B::UnPack((B *)obj,resolver);
  }
  else if (type == C) {
    obj_local = C::UnPack((C *)obj,resolver);
  }
  else {
    obj_local = (void *)0x0;
  }
  return obj_local;
}

Assistant:

inline void *ABCUnion::UnPack(const void *obj, ABC type, const ::flatbuffers::resolver_function_t *resolver) {
  (void)resolver;
  switch (type) {
    case ABC::A: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::A *>(obj);
      return ptr->UnPack(resolver);
    }
    case ABC::B: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::B *>(obj);
      return ptr->UnPack(resolver);
    }
    case ABC::C: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::C *>(obj);
      return ptr->UnPack(resolver);
    }
    default: return nullptr;
  }
}